

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PLYReader.cc
# Opt level: O0

ssize_t __thiscall
OpenMesh::IO::_PLYReader_::read(_PLYReader_ *this,int __fd,void *__buf,size_t __nbytes)

{
  bool bVar1;
  bool bVar2;
  ulong uVar3;
  mostream *pmVar4;
  ostream *this_00;
  undefined7 extraout_var;
  undefined7 extraout_var_00;
  undefined7 extraout_var_01;
  undefined7 uVar5;
  undefined4 in_register_00000034;
  bool local_41;
  bool swap;
  Options *_opt_local;
  BaseImporter *_bi_local;
  istream *_in_local;
  _PLYReader_ *this_local;
  
  uVar3 = std::ios::good();
  if ((uVar3 & 1) == 0) {
    pmVar4 = omerr();
    this_00 = std::operator<<(&pmVar4->super_ostream,"[PLYReader] : cannot not use stream");
    std::ostream::operator<<(this_00,std::endl<char,std::char_traits<char>>);
    this_local._7_1_ = false;
    uVar5 = extraout_var;
  }
  else {
    bVar1 = Options::check((Options *)__nbytes,6);
    Options::operator=(&this->userOptions_,(Options *)__nbytes);
    Options::clear((Options *)__nbytes);
    bVar2 = Options::vertex_has_normal(&this->options_);
    if ((bVar2) && (bVar2 = Options::vertex_has_normal(&this->userOptions_), bVar2)) {
      Options::operator+=((Options *)__nbytes,0x10);
    }
    bVar2 = Options::vertex_has_texcoord(&this->options_);
    if ((bVar2) && (bVar2 = Options::vertex_has_texcoord(&this->userOptions_), bVar2)) {
      Options::operator+=((Options *)__nbytes,0x40);
    }
    bVar2 = Options::vertex_has_color(&this->options_);
    if ((bVar2) && (bVar2 = Options::vertex_has_color(&this->userOptions_), bVar2)) {
      Options::operator+=((Options *)__nbytes,0x20);
    }
    bVar2 = Options::face_has_color(&this->options_);
    if ((bVar2) && (bVar2 = Options::face_has_color(&this->userOptions_), bVar2)) {
      Options::operator+=((Options *)__nbytes,0x200);
    }
    bVar2 = Options::is_binary(&this->options_);
    if (bVar2) {
      Options::operator+=((Options *)__nbytes,1);
    }
    bVar2 = Options::color_is_float(&this->options_);
    if (bVar2) {
      Options::operator+=((Options *)__nbytes,0x1000);
    }
    bVar2 = Options::check(&this->options_,0x2000);
    if ((bVar2) && (bVar2 = Options::check(&this->userOptions_,0x2000), bVar2)) {
      Options::operator+=((Options *)__nbytes,0x2000);
    }
    bVar2 = Options::is_binary(&this->options_);
    if (bVar2) {
      local_41 = read_binary(this,(istream *)CONCAT44(in_register_00000034,__fd),
                             (BaseImporter *)__buf,bVar1,(Options *)__nbytes);
      uVar5 = extraout_var_00;
    }
    else {
      local_41 = read_ascii(this,(istream *)CONCAT44(in_register_00000034,__fd),
                            (BaseImporter *)__buf,(Options *)__nbytes);
      uVar5 = extraout_var_01;
    }
    this_local._7_1_ = local_41;
  }
  return CONCAT71(uVar5,this_local._7_1_);
}

Assistant:

bool _PLYReader_::read(std::istream& _in, BaseImporter& _bi, Options& _opt) {

    if (!_in.good()) {
        omerr() << "[PLYReader] : cannot not use stream" << std::endl;
        return false;
    }

    // filter relevant options for reading
    bool swap = _opt.check(Options::Swap);

    userOptions_ = _opt;

    // build options to be returned
    _opt.clear();

    if (options_.vertex_has_normal() && userOptions_.vertex_has_normal()) {
        _opt += Options::VertexNormal;
    }
    if (options_.vertex_has_texcoord() && userOptions_.vertex_has_texcoord()) {
        _opt += Options::VertexTexCoord;
    }
    if (options_.vertex_has_color() && userOptions_.vertex_has_color()) {
        _opt += Options::VertexColor;
    }
    if (options_.face_has_color() && userOptions_.face_has_color()) {
        _opt += Options::FaceColor;
    }
    if (options_.is_binary()) {
        _opt += Options::Binary;
    }
    if (options_.color_is_float()) {
        _opt += Options::ColorFloat;
    }
    if (options_.check(Options::Custom) && userOptions_.check(Options::Custom)) {
        _opt += Options::Custom;
    }

    //    //force user-choice for the alpha value when reading binary
    //    if ( options_.is_binary() && userOptions_.color_has_alpha() )
    //      options_ += Options::ColorAlpha;

    return (options_.is_binary() ? read_binary(_in, _bi, swap, _opt) : read_ascii(_in, _bi, _opt));

}